

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetKernelGetProfileInfo
          (zet_kernel_handle_t hKernel,zet_profile_properties_t *pProfileProperties)

{
  zet_pfnKernelGetProfileInfo_t pfnGetProfileInfo;
  ze_result_t result;
  zet_profile_properties_t *pProfileProperties_local;
  zet_kernel_handle_t hKernel_local;
  
  pfnGetProfileInfo._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c858 != (code *)0x0) {
    pfnGetProfileInfo._4_4_ = (*DAT_0011c858)(hKernel,pProfileProperties);
  }
  return pfnGetProfileInfo._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetKernelGetProfileInfo(
        zet_kernel_handle_t hKernel,                    ///< [in] handle to kernel
        zet_profile_properties_t* pProfileProperties    ///< [out] pointer to profile properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetProfileInfo = context.zetDdiTable.Kernel.pfnGetProfileInfo;
        if( nullptr != pfnGetProfileInfo )
        {
            result = pfnGetProfileInfo( hKernel, pProfileProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }